

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_sle(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *a1;
  TCGTemp *a3;
  uintptr_t o;
  uintptr_t o_2;
  TCGv_i64 ret;
  uintptr_t o_1;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  a3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a3 - (long)s);
  tcg_gen_andi_i64_ppc64(s,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),0x1f)
  ;
  tcg_gen_op3_ppc64(s,INDEX_op_shl_i64,(TCGArg)a1,
                    (long)&s->pool_cur +
                    *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),(TCGArg)a3);
  tcg_gen_subfi_i64_ppc64(s,ret,0x20,ret);
  tcg_gen_op3_ppc64(s,INDEX_op_shr_i64,(TCGArg)a3,
                    (long)&s->pool_cur +
                    *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),(TCGArg)a3);
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,(TCGArg)a3,(TCGArg)a1,(TCGArg)a3);
  if (cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] != (TCGv_i64)((long)a1 - (long)s)) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,
                      (TCGArg)((long)&s->pool_cur +
                              (long)cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]),(TCGArg)a1)
    ;
  }
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a3,(TCGArg)(s->cpu_env + (long)s),0xb18);
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s) + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  if ((ctx->opcode & 1) != 0) {
    gen_sle_cold_1();
  }
  return;
}

Assistant:

static void gen_sle(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, t1, cpu_gpr[rB(ctx->opcode)], 0x1F);
    tcg_gen_shl_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], t1);
    tcg_gen_subfi_tl(tcg_ctx, t1, 32, t1);
    tcg_gen_shr_tl(tcg_ctx, t1, cpu_gpr[rS(ctx->opcode)], t1);
    tcg_gen_or_tl(tcg_ctx, t1, t0, t1);
    tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0);
    gen_store_spr(tcg_ctx, SPR_MQ, t1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}